

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

int __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskWrite>::init
          (MSCase<vkt::pipeline::multisample::MSCaseSampleMaskWrite> *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  MSCase<vkt::pipeline::multisample::MSCaseSampleMaskWrite> *local_10;
  MSCase<vkt::pipeline::multisample::MSCaseSampleMaskWrite> *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_MSCaseBaseResolveAndPerSampleFetch).super_MultisampleCaseBase.
                       super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_190,
                      (char (*) [52])"Discarding half of the samples using gl_SampleMask.");
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [66])
                             "Expecting half intensity on multisample targets (numSamples > 1)\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseSampleMaskWrite>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Discarding half of the samples using gl_SampleMask."
		<< "Expecting half intensity on multisample targets (numSamples > 1)\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}